

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_handle_graph.cpp
# Opt level: O0

path_handle_t __thiscall
handlegraph::MutablePathHandleGraph::rename_path
          (MutablePathHandleGraph *this,path_handle_t *path_handle,string *new_name)

{
  long lVar1;
  __type_conflict _Var2;
  bool bVar3;
  byte bVar4;
  iterator *this_00;
  path_handle_t pVar5;
  iterator *in_RDX;
  char (*in_RSI) [8];
  iterator *in_RDI;
  handle_t handle;
  iterator __end1;
  iterator __begin1;
  PathForEachSocket *__range1;
  path_handle_t renamed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  PathForEachSocket local_58;
  PathForEachSocket *local_48;
  string local_40 [32];
  iterator *local_20;
  char (*local_18) [8];
  char local_8 [8];
  
  lVar1 = *(long *)(*(long *)(in_RDI->step).data + -0x168);
  local_20 = in_RDX;
  local_18 = in_RSI;
  (**(code **)(*(long *)((in_RDI->step).data + lVar1) + 0xb8))
            (local_40,(in_RDI->step).data + lVar1,in_RSI);
  _Var2 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_40);
  if (_Var2) {
    local_8 = *local_18;
  }
  else {
    local_8 = (char  [8])(**(code **)(*(long *)(in_RDI->step).data + 0x158))(in_RDI,local_20,0);
    local_58 = PathHandleGraph::scan_path((PathHandleGraph *)in_RDX,(path_handle_t *)in_RDI);
    local_48 = &local_58;
    PathForEachSocket::begin((PathForEachSocket *)in_stack_ffffffffffffff60);
    PathForEachSocket::end((PathForEachSocket *)in_stack_ffffffffffffff60);
    while( true ) {
      bVar3 = PathForEachSocket::iterator::operator!=(in_RDX,in_RDI);
      if (!bVar3) break;
      PathForEachSocket::iterator::operator*(in_RDI);
      this_00 = (iterator *)
                (**(code **)(*(long *)(in_RDI->step).data + 0x168))
                          (in_RDI,local_8,&stack0xffffffffffffff60);
      PathForEachSocket::iterator::operator++(this_00);
    }
    lVar1 = *(long *)(*(long *)(in_RDI->step).data + -0x168);
    bVar4 = (**(code **)(*(long *)((in_RDI->step).data + lVar1) + 0xc0))
                      ((in_RDI->step).data + lVar1,local_18);
    (**(code **)(*(long *)(in_RDI->step).data + 400))(in_RDI,local_8,bVar4 & 1);
    (**(code **)(*(long *)(in_RDI->step).data + 0x148))(in_RDI,local_18);
  }
  pVar5.data[0] = local_8[0];
  pVar5.data[1] = local_8[1];
  pVar5.data[2] = local_8[2];
  pVar5.data[3] = local_8[3];
  pVar5.data[4] = local_8[4];
  pVar5.data[5] = local_8[5];
  pVar5.data[6] = local_8[6];
  pVar5.data[7] = local_8[7];
  return (path_handle_t)pVar5.data;
}

Assistant:

path_handle_t MutablePathHandleGraph::rename_path(const path_handle_t& path_handle,
                                                  const std::string& new_name) {
    if (new_name == get_path_name(path_handle)) {
        return path_handle;
    }
    // if no overwritten implementation, just copy the path
    path_handle_t renamed = create_path_handle(new_name);
    for (handle_t handle : scan_path(path_handle)) {
        append_step(renamed, handle);
    }
    set_circularity(renamed, get_is_circular(path_handle));
    destroy_path(path_handle);
    return renamed;
}